

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O0

void wabt::WriteS32Leb128(Stream *stream,int32_t value,char *desc)

{
  byte bVar1;
  uint8_t byte_1;
  size_t sStack_30;
  uint8_t byte;
  Offset length;
  char *pcStack_20;
  uint8_t data [5];
  char *desc_local;
  int32_t value_local;
  Stream *stream_local;
  
  sStack_30 = 0;
  pcStack_20 = desc;
  desc_local._4_4_ = value;
  if (value < 0) {
    while( true ) {
      bVar1 = (byte)desc_local._4_4_ & 0x7f;
      if (((int)desc_local._4_4_ >> 7 == 0xffffffff) && ((desc_local._4_4_ & 0x40) != 0)) break;
      *(byte *)((long)&length + sStack_30 + 3) = bVar1 | 0x80;
      sStack_30 = sStack_30 + 1;
      desc_local._4_4_ = (int)desc_local._4_4_ >> 7;
    }
    *(byte *)((long)&length + sStack_30 + 3) = bVar1;
  }
  else {
    while( true ) {
      bVar1 = (byte)desc_local._4_4_ & 0x7f;
      if (((int)desc_local._4_4_ >> 7 == 0) && ((desc_local._4_4_ & 0x40) == 0)) break;
      *(byte *)((long)&length + sStack_30 + 3) = bVar1 | 0x80;
      sStack_30 = sStack_30 + 1;
      desc_local._4_4_ = (int)desc_local._4_4_ >> 7;
    }
    *(byte *)((long)&length + sStack_30 + 3) = bVar1;
  }
  sStack_30 = sStack_30 + 1;
  Stream::WriteData(stream,(void *)((long)&length + 3),sStack_30,pcStack_20,No);
  return;
}

Assistant:

static void WriteS32Leb128(Stream* stream, int32_t value, const char* desc) {
  uint8_t data[MAX_U32_LEB128_BYTES];
  Offset length = 0;
  if (value < 0) {
    LEB128_LOOP_UNTIL(value == -1 && (byte & 0x40));
  } else {
    LEB128_LOOP_UNTIL(value == 0 && !(byte & 0x40));
  }

  stream->WriteData(data, length, desc);
}